

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O0

void __thiscall
rapidjson::
GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
SetObjectRaw(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *this,Member *members,SizeType count,
            MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator)

{
  GenericMember<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *__dest;
  uint in_EDX;
  void *in_RSI;
  uint *in_RDI;
  Member *m;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *in_stack_ffffffffffffffa0;
  
  *(undefined2 *)((long)in_RDI + 0xe) = 3;
  if (in_EDX == 0) {
    *(ulong *)(in_RDI + 2) = *(ulong *)(in_RDI + 2) & 0xffff000000000000;
  }
  else {
    __dest = Malloc<rapidjson::GenericMember<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       (in_stack_ffffffffffffffa0,(size_t)in_RDI);
    *(ulong *)(in_RDI + 2) = *(ulong *)(in_RDI + 2) & 0xffff000000000000 | (ulong)__dest;
    memcpy(__dest,in_RSI,(ulong)in_EDX << 5);
  }
  in_RDI[1] = in_EDX;
  *in_RDI = in_EDX;
  return;
}

Assistant:

void SetObjectRaw(Member* members, SizeType count, Allocator& allocator) {
        data_.f.flags = kObjectFlag;
        if (count) {
            Member* m = DoAllocMembers(count, allocator);
            SetMembersPointer(m);
            std::memcpy(static_cast<void*>(m), members, count * sizeof(Member));
#if RAPIDJSON_USE_MEMBERSMAP
            Map* &map = GetMap(m);
            MapIterator* mit = GetMapIterators(map);
            for (SizeType i = 0; i < count; i++) {
                new (&mit[i]) MapIterator(map->insert(MapPair(m[i].name.data_, i)));
            }
#endif
        }
        else
            SetMembersPointer(0);
        data_.o.size = data_.o.capacity = count;
    }